

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flex-estimation-test.cpp
# Opt level: O3

int testConstant(void)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  uint uVar5;
  ostream *poVar6;
  undefined8 *puVar7;
  PointerType pdVar8;
  long *plVar9;
  Index index;
  long lVar10;
  ulong uVar11;
  double dVar12;
  double *pdVar13;
  char *__function;
  long lVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  ulong uVar18;
  MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1> *pMVar19;
  ActualDstType actualDst;
  Matrix<double,_4,_4,_0,_4,_4> *pMVar20;
  byte bVar21;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  double dVar22;
  Vector v2;
  Matrix3 rt;
  IndexedMatrixArray xh;
  Vector uConstant;
  Vector yConstant;
  Vector xh0;
  IndexedMatrixArray u;
  Matrix3 res;
  Matrix4 m;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  contactPositions;
  IndexedMatrixArray y;
  Matrix4 m2;
  Vector3 contact;
  ofstream f;
  assign_op<double,_double> local_709;
  undefined8 *local_708;
  double dStack_700;
  Matrix<double,_3,_3,_0,_3,_3> local_6f8;
  uint local_6a8 [2];
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_6a0 [16];
  long local_690;
  long local_688;
  long local_680;
  long local_678;
  long local_670;
  long local_668;
  long local_658;
  void *local_650;
  long local_648;
  void *local_640;
  long local_638;
  Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false> local_630;
  double local_5f8;
  double dStack_5f0;
  void *local_5e8 [2];
  undefined1 local_5d8 [24];
  long local_5c0;
  long local_5b8;
  long local_5b0;
  long local_5a8;
  long local_5a0;
  long local_598;
  long local_588;
  Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,_const_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>
  local_580;
  Matrix<double,_4,_4,_0,_4,_4> local_538;
  undefined1 local_4b8 [24];
  Matrix<double,_3,_3,_0,_3,_3> *local_4a0;
  undefined8 uStack_498;
  undefined8 local_490;
  double local_488;
  undefined8 uStack_480;
  undefined8 local_478;
  undefined8 uStack_470;
  undefined8 local_468;
  undefined8 local_460;
  undefined8 local_458;
  undefined8 uStack_450;
  double local_448;
  undefined8 local_440;
  undefined1 local_438 [16];
  void *local_428;
  undefined8 uStack_420;
  undefined8 local_418;
  uint local_410 [2];
  deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
  local_408 [16];
  long local_3f8;
  long local_3f0;
  long local_3e8;
  long local_3e0;
  long local_3d8;
  long local_3d0;
  double adStack_3c8 [2];
  Matrix<double,_4,_4,_0,_4,_4> local_3b8;
  double local_338;
  undefined8 uStack_330;
  double local_328;
  double dStack_320;
  undefined1 local_318 [16];
  double local_308;
  double dStack_300;
  undefined8 local_2f8;
  undefined8 uStack_2f0;
  Matrix<double,_3,_1,_0,_3,_1> local_2e8;
  MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1> *local_2d0;
  Matrix<double,_4,_4,_0,_4,_4> *local_2c8;
  Matrix<double,_4,_4,_0,_4,_4> local_2b8;
  undefined1 local_230 [16];
  Index local_220;
  ios_base local_138 [264];
  
  bVar21 = 0;
  stateObservation::IndexedMatrixArray::IndexedMatrixArray((IndexedMatrixArray *)local_410);
  stateObservation::IndexedMatrixArray::IndexedMatrixArray((IndexedMatrixArray *)local_5d8);
  local_2e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[0] =
       0.311236;
  local_2e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[1] =
       -0.355773;
  local_2e8.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       1.1;
  local_230._0_8_ = (double *)0x6;
  local_220 = 0;
  Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_640,
             (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)local_230);
  if (1 < local_638) {
    *(undefined8 *)((long)local_640 + 8) = 0x402399999999999a;
    local_230._0_8_ = (double *)0xf;
    local_220 = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)&local_650,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)local_230);
    if (2 < local_648) {
      *(undefined8 *)((long)local_650 + 0x10) = 0x3ffccccccccccccd;
      uVar16 = 1;
      do {
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_230,
                   (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_640);
        lVar10 = (local_3d8 - local_3d0 >> 3) * -0x5555555555555555 +
                 (((long)adStack_3c8[1] - local_3e0 >> 3) + -1 + (ulong)(adStack_3c8[1] == 0.0)) *
                 0x15;
        lVar14 = local_3e8 - local_3f8 >> 3;
        lVar17 = lVar14 * -0x5555555555555555 + lVar10;
        uVar15 = (uint)uVar16;
        if (lVar17 == 0) {
LAB_00106773:
          if (lVar10 == lVar14 * 0x5555555555555555) {
            local_410[0] = uVar15;
          }
          std::
          deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
          ::push_back(local_408,(value_type *)local_230);
        }
        else {
          uVar18 = lVar17 + (ulong)local_410[0];
          if ((uVar16 < local_410[0]) || (uVar18 <= uVar16)) {
            if (uVar16 != uVar18) goto LAB_00107b01;
            goto LAB_00106773;
          }
          uVar18 = (ulong)(uVar15 - local_410[0]);
          uVar11 = (local_3f8 - local_3f0 >> 3) * -0x5555555555555555 + uVar18;
          if ((long)uVar11 < 0) {
            uVar18 = ~(~uVar11 / 0x15);
LAB_001067dd:
            lVar10 = uVar18 * -0x1f8 + *(long *)(local_3e0 + uVar18 * 8);
            uVar18 = uVar11;
          }
          else {
            lVar10 = local_3f8;
            if (0x14 < uVar11) {
              uVar18 = uVar11 / 0x15;
              goto LAB_001067dd;
            }
          }
          Eigen::internal::
          call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                    ((Matrix<double,__1,__1,_0,__1,__1> *)(lVar10 + uVar18 * 0x18),
                     (Matrix<double,__1,__1,_0,__1,__1> *)local_230,
                     (assign_op<double,_double> *)local_4b8);
        }
        free((void *)local_230._0_8_);
        Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
        PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
                  ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_230,
                   (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_650);
        lVar10 = (local_5a0 - local_598 >> 3) * -0x5555555555555555 +
                 ((local_588 - local_5a8 >> 3) + -1 + (ulong)(local_588 == 0)) * 0x15;
        lVar14 = local_5b0 - local_5c0 >> 3;
        lVar17 = lVar14 * -0x5555555555555555 + lVar10;
        if (lVar17 == 0) {
LAB_001068ca:
          if (lVar10 == lVar14 * 0x5555555555555555) {
            local_5d8._0_4_ = uVar15;
          }
          std::
          deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
          ::push_back((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                       *)(local_5d8 + 8),(value_type *)local_230);
        }
        else {
          uVar18 = lVar17 + (ulong)(uint)local_5d8._0_4_;
          if ((uVar16 < (uint)local_5d8._0_4_) || (uVar18 <= uVar16)) {
            if (uVar16 != uVar18) {
LAB_00107b01:
              __assert_fail("(v_.size()==0 || k_+v_.size() == time )&& \"Error: New time instants must be consecutive to existing ones\""
                            ,
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/tools/definitions.hxx"
                            ,0xaa,
                            "void stateObservation::IndexedMatrixArray::checkNext_(unsigned int) const"
                           );
            }
            goto LAB_001068ca;
          }
          uVar18 = (ulong)(uVar15 - local_5d8._0_4_);
          uVar11 = (local_5c0 - local_5b8 >> 3) * -0x5555555555555555 + uVar18;
          if ((long)uVar11 < 0) {
            uVar18 = ~(~uVar11 / 0x15);
LAB_00106934:
            lVar10 = uVar18 * -0x1f8 + *(long *)(local_5a8 + uVar18 * 8);
            uVar18 = uVar11;
          }
          else {
            lVar10 = local_5c0;
            if (0x14 < uVar11) {
              uVar18 = uVar11 / 0x15;
              goto LAB_00106934;
            }
          }
          Eigen::internal::
          call_dense_assignment_loop<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::internal::assign_op<double,double>>
                    ((Matrix<double,__1,__1,_0,__1,__1> *)(lVar10 + uVar18 * 0x18),
                     (Matrix<double,__1,__1,_0,__1,__1> *)local_230,
                     (assign_op<double,_double> *)local_4b8);
        }
        free((void *)local_230._0_8_);
        uVar16 = uVar16 + 1;
      } while (uVar16 != 0x1389);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_230,
                 (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&local_650);
      if ((local_5a0 - local_598 >> 3) * -0x5555555555555555 +
          ((local_588 - local_5a8 >> 3) + -1 + (ulong)(local_588 == 0)) * 0x15 ==
          (local_5b0 - local_5c0 >> 3) * 0x5555555555555555) {
        local_5d8._0_4_ = 0;
      }
      std::
      deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
      ::push_back((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                   *)(local_5d8 + 8),(value_type *)local_230);
      free((void *)local_230._0_8_);
      local_230._0_8_ = (double *)0x12;
      local_220 = 0;
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,1,0,-1,1>>::
      PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>> *)local_5e8,
                 (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  *)local_230);
      local_428 = (void *)0x0;
      uStack_420 = 0;
      local_418 = 0;
      std::
      vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
      ::_M_realloc_insert<Eigen::Matrix<double,3,1,0,3,1>const&>
                ((vector<Eigen::Matrix<double,3,1,0,3,1>,Eigen::aligned_allocator<Eigen::Matrix<double,3,1,0,3,1>>>
                  *)&local_428,(iterator)0x0,&local_2e8);
      Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
      PlainObjectBase<Eigen::Matrix<double,_1,1,0,_1,1>>
                ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)local_230,
                 (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_5e8);
      stateObservation::examples::offlineEKFFlexibilityEstimation
                ((IndexedMatrixArray *)local_6a8,(IndexedMatrixArray *)local_410,(Matrix *)local_5d8
                 ,(uint)local_230,
                 (vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                  *)0x1,0.0,(IndexedMatrixArray *)&local_428,(IndexedMatrixArray *)0x0);
      free((void *)local_230._0_8_);
      std::ofstream::ofstream(local_230);
      std::ofstream::open(local_230,0x10e190);
      uVar15 = 0;
      if ((local_670 - local_668 >> 3) * -0x5555555555555555 +
          ((local_658 - local_678 >> 3) + -1 + (ulong)(local_658 == 0)) * 0x15 !=
          (local_680 - local_690 >> 3) * 0x5555555555555555) {
        uVar15 = local_6a8[0];
      }
      do {
        lVar10 = (local_680 - local_690 >> 3) * -0x5555555555555555 +
                 (local_670 - local_668 >> 3) * -0x5555555555555555 +
                 ((local_658 - local_678 >> 3) + -1 + (ulong)(local_658 == 0)) * 0x15;
        uVar5 = (local_6a8[0] - 1) + (int)lVar10;
        if (lVar10 == 0) {
          uVar5 = 0;
        }
        if (uVar5 < uVar15) {
          local_230._0_8_ = _VTT;
          *(undefined8 *)(local_230 + (long)_VTT[-3]) = __filebuf;
          std::filebuf::~filebuf((filebuf *)(local_230 + 8));
          std::ios_base::~ios_base(local_138);
          std::
          deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
          ::~deque(local_6a0);
          if (local_428 != (void *)0x0) {
            free(local_428);
          }
          free(local_5e8[0]);
          free(local_650);
          free(local_640);
          std::
          deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
          ::~deque((deque<Eigen::Matrix<double,__1,__1,_0,__1,__1>,_std::allocator<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                    *)(local_5d8 + 8));
          std::
          deque<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_std::allocator<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>
          ::~deque(local_408);
          return 0;
        }
        uVar16 = (ulong)uVar15;
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)local_230);
        std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
        lVar10 = (local_680 - local_690 >> 3) * -0x5555555555555555 +
                 (local_670 - local_668 >> 3) * -0x5555555555555555 +
                 ((local_658 - local_678 >> 3) + -1 + (ulong)(local_658 == 0)) * 0x15;
        if (lVar10 == 0) goto LAB_001079e1;
        uVar18 = (ulong)(uVar15 - local_6a8[0]);
        if ((uVar15 < local_6a8[0]) || (lVar10 + (ulong)local_6a8[0] <= uVar16)) goto LAB_001079e1;
        uVar11 = (local_690 - local_688 >> 3) * -0x5555555555555555 + uVar18;
        if ((long)uVar11 < 0) {
          uVar18 = ~(~uVar11 / 0x15);
LAB_00106cf0:
          lVar10 = uVar18 * -0x1f8 + *(long *)(local_678 + uVar18 * 8);
          uVar18 = uVar11;
        }
        else {
          lVar10 = local_690;
          if (0x14 < uVar11) {
            uVar18 = uVar11 / 0x15;
            goto LAB_00106cf0;
          }
        }
        local_4b8._0_8_ = lVar10 + uVar18 * 0x18;
        poVar6 = Eigen::operator<<(poVar6,(DenseBase<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                                           *)local_4b8);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        std::ostream::flush();
        local_708 = (undefined8 *)0x0;
        dStack_700 = 0.0;
        puVar7 = (undefined8 *)malloc(0x30);
        if (((ulong)puVar7 & 0xf) != 0) goto LAB_00107a1f;
        if (puVar7 == (undefined8 *)0x0) {
          puVar7 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar7 = acos;
          __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        dStack_700 = 2.96439387504748e-323;
        puVar7[4] = 0;
        puVar7[5] = 0;
        puVar7[2] = 0;
        puVar7[3] = 0;
        *puVar7 = 0;
        puVar7[1] = 0;
        lVar10 = (local_680 - local_690 >> 3) * -0x5555555555555555 +
                 (local_670 - local_668 >> 3) * -0x5555555555555555 +
                 ((local_658 - local_678 >> 3) + -1 + (ulong)(local_658 == 0)) * 0x15;
        local_708 = puVar7;
        if (lVar10 == 0) goto LAB_001079e1;
        uVar18 = (ulong)(uVar15 - local_6a8[0]);
        if ((uVar15 < local_6a8[0]) || (lVar10 + (ulong)local_6a8[0] <= uVar16)) goto LAB_001079e1;
        uVar11 = (local_690 - local_688 >> 3) * -0x5555555555555555 + uVar18;
        if ((long)uVar11 < 0) {
          uVar18 = ~(~uVar11 / 0x15);
LAB_00106e72:
          lVar10 = uVar18 * -0x1f8 + *(long *)(local_678 + uVar18 * 8);
          uVar18 = uVar11;
        }
        else {
          lVar10 = local_690;
          if (0x14 < uVar11) {
            uVar18 = uVar11 / 0x15;
            goto LAB_00106e72;
          }
        }
        plVar9 = (long *)(lVar10 + uVar18 * 0x18);
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] = 0.0;
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] = 0.0;
        lVar10 = *plVar9;
        dVar1 = (double)plVar9[1];
        if (dVar1 == 0.0) {
          dVar12 = 0.0;
          if (plVar9[2] == 1) goto LAB_00106f37;
LAB_00107a3e:
          local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[1] = 0.0;
          local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0] = 0.0;
          __function = 
          "void Eigen::PlainObjectBase<Eigen::Matrix<double, -1, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, -1, 1>]"
          ;
          goto LAB_00107af7;
        }
        if (((long)dVar1 < 0) || (plVar9[2] != 1)) goto LAB_00107a3e;
        if (0x1fffffffffffffff < (ulong)dVar1) {
LAB_00107a58:
          puVar7 = (undefined8 *)__cxa_allocate_exception(8);
          *puVar7 = acos;
          __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
        }
        pdVar8 = (PointerType)malloc((long)dVar1 * 8);
        if (dVar1 != 4.94065645841247e-324 && ((ulong)pdVar8 & 0xf) != 0) goto LAB_00107a1f;
        if (pdVar8 == (PointerType)0x0) goto LAB_00107a58;
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] = (double)pdVar8;
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] = dVar1;
        if (dVar1 == 4.94065645841247e-324) {
          dVar12 = 0.0;
        }
        else {
          dVar12 = (double)((ulong)dVar1 & 0x1ffffffffffffffe);
          dVar22 = 0.0;
          do {
            pdVar13 = (double *)(lVar10 + (long)dVar22 * 8);
            dVar4 = pdVar13[1];
            pdVar8[(long)dVar22] = *pdVar13;
            (pdVar8 + (long)dVar22)[1] = dVar4;
            dVar22 = (double)((long)dVar22 + 2);
          } while ((ulong)dVar22 < (ulong)dVar12);
        }
LAB_00106f37:
        if ((long)dVar12 < (long)dVar1) {
          do {
            *(double *)
             ((long)local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[0] + dVar12 * 8) = *(double *)(lVar10 + (long)dVar12 * 8);
            dVar12 = (double)((long)dVar12 + 1);
          } while (dVar1 != dVar12);
        }
        local_4b8._8_8_ = 3;
        local_4a0 = &local_6f8;
        uStack_498 = 0;
        local_4b8._0_8_ =
             local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data
             .array[0];
        local_488 = dVar1;
        if ((long)dVar1 < 3) goto LAB_00107a00;
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[1] = 1.48219693752374e-323;
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0] = (double)local_708;
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[3] = (double)&local_708;
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[4] = 0.0;
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[6] = 2.96439387504748e-323;
        Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_1>::
        operator=((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1> *)
                  &local_538,
                  (MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1> *)
                  local_4b8);
        free((void *)local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[0]);
        lVar10 = (local_680 - local_690 >> 3) * -0x5555555555555555 +
                 (local_670 - local_668 >> 3) * -0x5555555555555555 +
                 ((local_658 - local_678 >> 3) + -1 + (ulong)(local_658 == 0)) * 0x15;
        if (lVar10 == 0) {
LAB_001079e1:
          __assert_fail("checkIndex(time) && \"Error: Time out of range\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/stack-of-tasks[P]state-observation/include/state-observation/tools/definitions.hxx"
                        ,0x9b,
                        "void stateObservation::IndexedMatrixArray::check_(unsigned int) const");
        }
        uVar18 = (ulong)(uVar15 - local_6a8[0]);
        if ((uVar15 < local_6a8[0]) || (lVar10 + (ulong)local_6a8[0] <= uVar16)) goto LAB_001079e1;
        uVar16 = (local_690 - local_688 >> 3) * -0x5555555555555555 + uVar18;
        if ((long)uVar16 < 0) {
          uVar18 = ~(~uVar16 / 0x15);
LAB_001070e6:
          lVar10 = uVar18 * -0x1f8 + *(long *)(local_678 + uVar18 * 8);
          uVar18 = uVar16;
        }
        else {
          lVar10 = local_690;
          if (0x14 < uVar16) {
            uVar18 = uVar16 / 0x15;
            goto LAB_001070e6;
          }
        }
        plVar9 = (long *)(lVar10 + uVar18 * 0x18);
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] = 0.0;
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] = 0.0;
        lVar10 = *plVar9;
        dVar1 = (double)plVar9[1];
        if (dVar1 == 0.0) {
          dVar12 = 0.0;
          if (plVar9[2] != 1) goto LAB_00107a3e;
        }
        else {
          if (((long)dVar1 < 0) || (plVar9[2] != 1)) goto LAB_00107a3e;
          if (0x1fffffffffffffff < (ulong)dVar1) {
LAB_00107a86:
            puVar7 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar7 = acos;
            __cxa_throw(puVar7,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
          }
          pdVar8 = (PointerType)malloc((long)dVar1 * 8);
          if (dVar1 != 4.94065645841247e-324 && ((ulong)pdVar8 & 0xf) != 0) {
LAB_00107a1f:
            __assert_fail("(size<16 || (std::size_t(result)%16)==0) && \"System\'s malloc returned an unaligned pointer. Compile with EIGEN_MALLOC_ALREADY_ALIGNED=0 to fallback to handmade aligned memory allocator.\""
                          ,"/usr/include/eigen3/Eigen/src/Core/util/Memory.h",0xb9,
                          "void *Eigen::internal::aligned_malloc(std::size_t)");
          }
          if (pdVar8 == (PointerType)0x0) goto LAB_00107a86;
          local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[0] = (double)pdVar8;
          local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
          array[1] = dVar1;
          if (dVar1 == 4.94065645841247e-324) {
            dVar12 = 0.0;
          }
          else {
            dVar12 = (double)((ulong)dVar1 & 0x1ffffffffffffffe);
            dVar22 = 0.0;
            do {
              pdVar13 = (double *)(lVar10 + (long)dVar22 * 8);
              dVar4 = pdVar13[1];
              pdVar8[(long)dVar22] = *pdVar13;
              (pdVar8 + (long)dVar22)[1] = dVar4;
              dVar22 = (double)((long)dVar22 + 2);
            } while ((ulong)dVar22 < (ulong)dVar12);
          }
        }
        if ((long)dVar12 < (long)dVar1) {
          do {
            *(double *)
             ((long)local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[0] + dVar12 * 8) = *(double *)(lVar10 + (long)dVar12 * 8);
            dVar12 = (double)((long)dVar12 + 1);
          } while (dVar1 != dVar12);
        }
        local_4b8._0_8_ =
             (long)local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                   m_data.array[0] + 0x18;
        local_4b8._8_8_ = 3;
        local_4a0 = &local_6f8;
        uStack_498 = 3;
        local_488 = dVar1;
        if ((long)dVar1 < 6) {
LAB_00107a00:
          local_4a0 = &local_6f8;
          local_4b8._8_8_ = 3;
          __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                        ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,
                        "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
                       );
        }
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[4] = (double)((long)dStack_700 + -3);
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[1] = 1.48219693752374e-323;
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0] = (double)(local_708 + (long)dStack_700 + -3);
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[3] = (double)&local_708;
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[6] = dStack_700;
        if ((long)dStack_700 < 3) goto LAB_00107a00;
        Eigen::MapBase<Eigen::Block<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_1>::
        operator=((MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1> *)
                  &local_538,
                  (MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1> *)
                  local_4b8);
        free((void *)local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[0]);
        if (dStack_700 != 2.96439387504748e-323) {
          __function = 
          "void Eigen::PlainObjectBase<Eigen::Matrix<double, 6, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 6, 1>]"
          ;
LAB_00107af7:
          __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                        ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,__function);
        }
        local_2f8 = *local_708;
        uStack_2f0 = local_708[1];
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] = (double)local_708[2];
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] = *(double *)*(undefined1 (*) [16])(local_708 + 3);
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] = (double)local_708[4];
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[3] = (double)local_708[5];
        local_4b8._0_8_ = (PointerType)0x3ff0000000000000;
        local_4a0 = (Matrix<double,_3,_3,_0,_3,_3> *)0x0;
        uStack_498 = 0;
        local_4b8._8_8_ = 0;
        local_4b8._16_8_ = 0;
        local_490 = 0x3ff0000000000000;
        local_478 = 0;
        uStack_470 = 0;
        local_488 = 0.0;
        uStack_480 = 0;
        local_468 = 0x3ff0000000000000;
        local_460 = 0;
        local_440 = 0x3ff0000000000000;
        dVar1 = local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[3] *
                local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[3] +
                local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[2] *
                local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[2] +
                local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[1] *
                local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                m_data.array[1];
        local_338 = SQRT(dVar1);
        if (9.999999999999999e-33 < dVar1) {
          auVar3._8_8_ = local_338;
          auVar3._0_8_ = local_338;
          local_438 = divpd(*(undefined1 (*) [16])(local_708 + 3),auVar3);
          local_5f8 = local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                      m_storage.m_data.array[3] / local_338;
          dStack_5f0 = local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                       m_storage.m_data.array[3];
        }
        else {
          local_438 = ZEXT816(0);
          local_5f8 = 1.0;
          dStack_5f0 = 0.0;
        }
        local_338 = (double)(-(ulong)(9.999999999999999e-33 < dVar1) & (ulong)local_338);
        uStack_330 = 0;
        local_308 = local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage
                    .m_data.array[0];
        dStack_300 = local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                     m_storage.m_data.array[1];
        dVar1 = sin(local_338);
        local_328 = dVar1 * (double)local_438._0_8_;
        dStack_320 = dVar1 * (double)local_438._8_8_;
        local_318._8_4_ = extraout_XMM0_Dc;
        local_318._0_8_ = dVar1 * local_5f8;
        local_318._12_4_ = extraout_XMM0_Dd;
        dVar1 = cos(local_338);
        dVar22 = 1.0 - dVar1;
        dVar12 = dVar22 * (double)local_438._0_8_;
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[6] = dStack_320 + local_5f8 * dVar12;
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[2] = local_5f8 * dVar12 - dStack_320;
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[3] = dVar12 * (double)local_438._8_8_ - (double)local_318._0_8_;
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0] = dVar1 + dVar12 * (double)local_438._0_8_;
        dVar12 = (double)local_318._0_8_ + dVar12 * (double)local_438._8_8_;
        auVar2._8_4_ = SUB84(dVar12,0);
        auVar2._0_8_ = local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.
                       m_storage.m_data.array[0];
        auVar2._12_4_ = (int)((ulong)dVar12 >> 0x20);
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[1] = (double)auVar2._8_8_;
        dVar12 = dVar22 * (double)local_438._8_8_ * local_5f8;
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[7] = dVar12 - local_328;
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[4] = dVar1 + dVar22 * (double)local_438._8_8_ * (double)local_438._8_8_;
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[5] = local_328 + dVar12;
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[8] = dVar22 * local_5f8 * local_5f8 + dVar1;
        lVar10 = 0x10;
        pdVar13 = local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array + 2;
        do {
          dVar1 = pdVar13[-1];
          *(double *)
           ((long)local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array + lVar10 + 0x70) =
               ((plain_array<double,_16,_0,_16> *)(pdVar13 + -2))->array[0];
          *(double *)
           ((long)local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array + lVar10 + 0x78) = dVar1;
          *(double *)(local_4b8 + lVar10) = *pdVar13;
          lVar10 = lVar10 + 0x20;
          pdVar13 = pdVar13 + 3;
        } while (lVar10 != 0x70);
        local_458 = local_2f8;
        uStack_450 = uStack_2f0;
        local_448 = local_308;
        lVar10 = 0x10;
        pMVar19 = (MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1> *)
                  local_4b8;
        pMVar20 = &local_2b8;
        for (lVar14 = 0x10; lVar14 != 0; lVar14 = lVar14 + -1) {
          (pMVar20->super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>).m_storage.m_data.
          array[0] = (double)(pMVar19->
                             super_MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
                             ).m_data;
          pMVar19 = (MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>
                     *)((long)pMVar19 + ((ulong)bVar21 * -2 + 1) * 8);
          pMVar20 = (Matrix<double,_4,_4,_0,_4,_4> *)((long)pMVar20 + ((ulong)bVar21 * -2 + 1) * 8);
        }
        local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0] = 1.0;
        local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[3] = 0.0;
        local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[4] = 0.0;
        local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[1] = 0.0;
        local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[2] = 0.0;
        local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[5] = 1.0;
        local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[8] = 0.0;
        local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[9] = 0.0;
        local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[6] = 0.0;
        local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[7] = 0.0;
        local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[10] = 1.0;
        local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0xd] = 0.0;
        local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0xe] = 0.0;
        local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0xb] = 0.0;
        local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0xc] = 0.0;
        local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0xf] = 1.0;
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] = local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0];
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] = local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[4];
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] = local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[8];
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[3] = local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[1];
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[4] = local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[5];
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[5] = local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[9];
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6] = local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[2];
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7] = local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[6];
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8] = local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[10];
        pdVar13 = local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array + 2;
        do {
          dVar1 = pdVar13[-1];
          *(double *)((long)adStack_3c8 + lVar10) =
               ((plain_array<double,_9,_0,_0> *)(pdVar13 + -2))->array[0];
          *(double *)
           ((long)local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array + lVar10 + -8) = dVar1;
          *(double *)
           ((long)local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array + lVar10) = *pdVar13;
          lVar10 = lVar10 + 0x20;
          pdVar13 = pdVar13 + 3;
        } while (lVar10 != 0x70);
        local_580.m_lhs.m_xpr = &local_6f8;
        local_580.m_rhs.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
             local_2b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
             .array + 0xc;
        local_580.m_rhs.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.
        m_value = 3;
        local_580.m_rhs.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.
        m_value = 1;
        local_580.m_rhs.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_xpr =
             &local_2b8;
        local_580.m_rhs.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startRow.
        m_value = 0;
        local_580.m_rhs.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startCol.
        m_value = 3;
        local_580.m_rhs.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        m_outerStride = 4;
        local_630.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
             local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
             .array + 0xc;
        local_630.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.
        m_value = 3;
        local_630.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.
        m_value = 1;
        local_630.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_xpr =
             &local_3b8;
        local_630.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startRow
        .m_value = 0;
        local_630.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startCol
        .m_value = 3;
        local_630.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        m_outerStride = 4;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,0>,Eigen::internal::assign_op<double,double>>
                  (&local_630,&local_580,&local_709,(type)0x0);
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[3] = 0.0;
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[4] = 0.0;
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array._0_16_ = ZEXT816(0x3ff0000000000000);
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[2] = 0.0;
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[5] = 1.0;
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[8] = 0.0;
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[9] = 0.0;
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[6] = 0.0;
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[7] = 0.0;
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[10] = 1.0;
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0xd] = 0.0;
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0xe] = 0.0;
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0xb] = 0.0;
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0xc] = 0.0;
        local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data.
        array[0xf] = 1.0;
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[0] = local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[0];
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[1] = local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[4];
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[2] = local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[8];
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[3] = local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[1];
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[4] = local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[5];
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[5] = local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[9];
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[6] = local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[2];
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[7] = local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[6];
        local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
        array[8] = local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                   m_data.array[10];
        lVar10 = 0x10;
        pdVar13 = local_6f8.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                  m_data.array + 2;
        do {
          dVar1 = pdVar13[-1];
          *(double *)
           ((long)local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array + lVar10 + -0x10) =
               ((plain_array<double,_9,_0,_0> *)(pdVar13 + -2))->array[0];
          *(double *)
           ((long)local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array + lVar10 + -8) = dVar1;
          *(double *)
           ((long)local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.
                  m_data.array + lVar10) = *pdVar13;
          lVar10 = lVar10 + 0x20;
          pdVar13 = pdVar13 + 3;
        } while (lVar10 != 0x70);
        local_580.m_lhs.m_xpr = &local_6f8;
        local_580.m_rhs.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
             local_3b8.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
             .array + 0xc;
        local_580.m_rhs.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.
        m_value = 3;
        local_580.m_rhs.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.
        m_value = 1;
        local_580.m_rhs.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_xpr =
             &local_3b8;
        local_580.m_rhs.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startRow.
        m_value = 0;
        local_580.m_rhs.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startCol.
        m_value = 3;
        local_580.m_rhs.
        super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>.
        super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        m_outerStride = 4;
        local_630.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_data =
             local_538.super_PlainObjectBase<Eigen::Matrix<double,_4,_4,_0,_4,_4>_>.m_storage.m_data
             .array + 0xc;
        local_630.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_rows.
        m_value = 3;
        local_630.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_1>.
        super_MapBase<Eigen::Block<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false>,_0>.m_cols.
        m_value = 1;
        local_630.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_xpr =
             &local_538;
        local_630.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startRow
        .m_value = 0;
        local_630.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.m_startCol
        .m_value = 3;
        local_630.super_BlockImpl<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_Eigen::Dense>
        .super_BlockImpl_dense<Eigen::Matrix<double,_4,_4,_0,_4,_4>,__1,__1,_false,_true>.
        m_outerStride = 4;
        Eigen::internal::
        call_assignment<Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,Eigen::Product<Eigen::CwiseUnaryOp<Eigen::internal::scalar_opposite_op<double>,Eigen::Matrix<double,3,3,0,3,3>const>,Eigen::Block<Eigen::Matrix<double,4,4,0,4,4>,_1,_1,false>,0>,Eigen::internal::assign_op<double,double>>
                  (&local_630,&local_580,&local_709,(type)0x0);
        local_2c8 = &local_538;
        local_2d0 = (MapBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_1>
                     *)local_4b8;
        poVar6 = Eigen::operator<<((ostream *)&std::cout,
                                   (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_difference_op<double,_double>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>,_const_Eigen::Matrix<double,_4,_4,_0,_4,_4>_>_>
                                    *)&local_2d0);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar6 + -0x18) + (char)poVar6);
        std::ostream::put((char)poVar6);
        plVar9 = (long *)std::ostream::flush();
        std::ios::widen((char)*(undefined8 *)(*plVar9 + -0x18) + (char)plVar9);
        std::ostream::put((char)plVar9);
        std::ostream::flush();
        free(local_708);
        uVar15 = uVar15 + 1;
      } while( true );
    }
  }
  __assert_fail("index >= 0 && index < size()",
                "/usr/include/eigen3/Eigen/src/Core/DenseCoeffsBase.h",0x19a,
                "Scalar &Eigen::DenseCoeffsBase<Eigen::Matrix<double, -1, 1>, 1>::operator[](Index) [Derived = Eigen::Matrix<double, -1, 1>, Level = 1]"
               );
}

Assistant:

int testConstant()
{
    /// The number of samples
    const unsigned kmax=5000;

    ///sampling period
    const double dt=1e-3;

    ///Sizes of the states for the state, the measurement, and the input vector
    const unsigned stateSize=18;
    const unsigned measurementSize=6;
    const unsigned inputSize=15;

    ///The array containing all the states, the measurements and the inputs
    IndexedMatrixArray y;
    IndexedMatrixArray u;

    Vector3 contact(Vector3::Zero());

    contact[0]=0.31123600000000001;
    contact[1]=-0.35577300000000001;
    contact[2]=1.1000000000000001;

    Vector yConstant = Vector::Zero(measurementSize,1);
    yConstant[1]=9.8;



    Vector uConstant = Vector::Zero(inputSize,1);
    uConstant[2]=1.8;

    {
        for ( unsigned i=1 ; i<kmax+1 ; ++i )
        {
            y.setValue(yConstant,i);
            u.setValue(uConstant,i);
        }
    }

    u.pushBack(uConstant);

    ///the initalization of a random estimation of the initial state
    Vector xh0=Vector::Zero(stateSize,1);

    std::vector<Vector3, Eigen::aligned_allocator<Vector3> > contactPositions;

    contactPositions.push_back(contact);

    stateObservation::IndexedMatrixArray xh=
        stateObservation::examples::offlineEKFFlexibilityEstimation
        (y,u,xh0,1,contactPositions,dt);

    ///file of output
    std::ofstream f;
    f.open("trajectory.dat");

    ///the reconstruction of the state
    for (unsigned i=xh.getFirstIndex();i<=xh.getLastIndex();++i)
    {
       f << i<<" "<< xh[i].transpose()
          << std::endl;

       Vector v2 (Matrix::Zero(6,1));

       v2.head(3) = Vector(xh[i]).segment(kine::pos,3);
       v2.tail(3) = Vector(xh[i]).segment(kine::ori,3);

       Matrix4 m= kine::vector6ToHomogeneousMatrix(v2);
       Vector4 v;
       v.head(3)=contact;
       v[3]=1;

       std::cout << m - kine::invertHomoMatrix(
                            kine::invertHomoMatrix(m))
                                        << std::endl << std::endl;

    }

    return 0;
}